

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argize.c
# Opt level: O2

int argize(char *cmdline,int *argc,char **argv,size_t argvlen)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  *argc = 0;
  pbVar5 = (byte *)cmdline;
  while( true ) {
    do {
      bVar1 = *pbVar5;
      if (bVar1 == 0) {
        *cmdline = 0;
        return 0;
      }
      ppuVar3 = __ctype_b_loc();
      pbVar4 = pbVar5;
      while ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x20) != 0) {
        cmdline = (char *)((byte *)cmdline + 1);
        bVar1 = pbVar4[1];
        pbVar4 = pbVar4 + 1;
      }
      pbVar5 = pbVar4;
    } while (bVar1 == 0);
    iVar2 = *argc;
    if (argvlen <= (ulong)(long)iVar2) break;
    *argc = iVar2 + 1;
    argv[iVar2] = cmdline;
    bVar1 = *pbVar4;
    ppuVar3 = __ctype_b_loc();
    pbVar5 = pbVar4 + 1;
    if ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x20) == 0) {
      if ((bVar1 != 0x22) && (bVar1 != 0x5c)) {
        *cmdline = bVar1;
        cmdline = (char *)((byte *)cmdline + 1);
      }
    }
    else {
      *pbVar4 = 0;
      *cmdline = 0;
      cmdline = (char *)((byte *)cmdline + 1);
    }
  }
  return 1;
}

Assistant:

int argize(char *cmdline, int *const argc, char *argv[], const size_t argvlen)
{
    char   *p, *q;
    int             state;

    p = q = cmdline;
    *argc = 0;
    state = 0;

    while (*p) {
        switch (state) {
        case 0:                                 /* skip leading white space */
            while (isspace((unsigned char)*p)) p++, q++;
            if (!*p) break;            /* If there's nothing left, get out. */
            state = 1;
            /* fall through */;

        case 1:                                                /* begin arg */
            if ((size_t)*argc < argvlen)
                argv[(*argc)++] = q;
            else
                return 1;
            state = 2;
            /* fall through */

        case 2:                            /* collect chars for current arg */
            if (isspace((unsigned char)*p))
                *q++ = *p++ = '\0', state = 0;        /* Terminate this arg */
            else if (*p == '"')
                p++, state = 3;                              /* Open quote. */
            else if (*p == '\\')
                p++, state = 4;                         /* Escape sequence. */
            else
                *q++ = *p++;                            /* Just keep going. */

            break;

        case 3:                             /* collect chars inside quotes. */
            switch (*p) {
            case '"' : p++; state = 2; break;                /* Close quote.*/
            case '\\': p++; state = 5; break;           /* Escape sequence. */
            default:   *q++ = *p++; break;
            }
            break;

        case 4:                        /* escaped character outside quotes. */
            *q++ = *p++; state = 2;
            break;

        case 5:                         /* escaped character inside quotes. */
            *q++ = *p++; state = 3;
            break;
        }
    }
    *q = '\0';
    return 0;
}